

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schematron.c
# Opt level: O0

xmlNodePtr xmlSchematronNextNode(xmlNodePtr cur)

{
  xmlElementType xVar1;
  xmlNodePtr local_18;
  xmlNodePtr cur_local;
  
  local_18 = cur;
  if (cur->children == (_xmlNode *)0x0) goto LAB_001be6ca;
  if (cur->children->type == XML_ENTITY_DECL) goto LAB_001be6ca;
  local_18 = cur->children;
  xVar1 = local_18->type;
  do {
    if (xVar1 != XML_DTD_NODE) {
      return local_18;
    }
LAB_001be6ca:
    do {
      if (local_18->next == (_xmlNode *)0x0) {
        do {
          local_18 = local_18->parent;
          if (local_18 == (_xmlNode *)0x0) {
            return (xmlNodePtr)0x0;
          }
          if (local_18->type == XML_DOCUMENT_NODE) {
            return (xmlNodePtr)0x0;
          }
          if (local_18->next != (_xmlNode *)0x0) {
            return local_18->next;
          }
        } while (local_18 != (_xmlNode *)0x0);
        return (xmlNodePtr)0x0;
      }
      local_18 = local_18->next;
    } while (local_18->type == XML_ENTITY_DECL);
    xVar1 = local_18->type;
  } while( true );
}

Assistant:

static xmlNodePtr
xmlSchematronNextNode(xmlNodePtr cur) {
    if (cur->children != NULL) {
	/*
	 * Do not descend on entities declarations
	 */
	if (cur->children->type != XML_ENTITY_DECL) {
	    cur = cur->children;
	    /*
	     * Skip DTDs
	     */
	    if (cur->type != XML_DTD_NODE)
		return(cur);
	}
    }

    while (cur->next != NULL) {
	cur = cur->next;
	if ((cur->type != XML_ENTITY_DECL) &&
	    (cur->type != XML_DTD_NODE))
	    return(cur);
    }

    do {
	cur = cur->parent;
	if (cur == NULL) break;
	if (cur->type == XML_DOCUMENT_NODE) return(NULL);
	if (cur->next != NULL) {
	    cur = cur->next;
	    return(cur);
	}
    } while (cur != NULL);
    return(cur);
}